

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::NonAnsiUdpPortListSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,NonAnsiUdpPortListSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (NonAnsiUdpPortListSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (NonAnsiUdpPortListSyntax *)0x1:
    return __return_storage_ptr__ + 3;
  case (NonAnsiUdpPortListSyntax *)0x2:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 6);
    break;
  case (NonAnsiUdpPortListSyntax *)0x3:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 7);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax NonAnsiUdpPortListSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openParen;
        case 1: return &ports;
        case 2: return &closeParen;
        case 3: return &semi;
        default: return nullptr;
    }
}